

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void BotTest<generic_bots::MinimaxBot<uttt::IBoard,minimax::ABeta<uttt::IBoard,uttt::Eval1>>,uttt::IBoard>
               (void)

{
  ostream *poVar1;
  int iVar2;
  MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> bot;
  IBoard game;
  char local_61;
  MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> local_60;
  IBoard local_48;
  
  uttt::IBoard::IBoard(&local_48);
  iVar2 = 1;
  do {
    local_60.super_IBot<uttt::IBoard>._vptr_IBot = (_func_int **)&PTR__IBot_00161830;
    local_60.super_IBot<uttt::IBoard>.game = (IBoard *)operator_new(0x18);
    (local_60.super_IBot<uttt::IBoard>.game)->macro = local_48.macro;
    ((local_60.super_IBot<uttt::IBoard>.game)->micro)._M_elems[0] = local_48.micro._M_elems[0];
    ((local_60.super_IBot<uttt::IBoard>.game)->micro)._M_elems[1] = local_48.micro._M_elems[1];
    *(undefined8 *)(((local_60.super_IBot<uttt::IBoard>.game)->micro)._M_elems + 2) =
         local_48.micro._M_elems._4_8_;
    *(undefined8 *)(((local_60.super_IBot<uttt::IBoard>.game)->micro)._M_elems + 6) =
         local_48._16_8_;
    local_60.super_IBot<uttt::IBoard>._vptr_IBot = (_func_int **)&PTR__IBot_00161a38;
    local_60.depth = iVar2;
    std::chrono::_V2::system_clock::now();
    generic_bots::MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_>::MakeMove
              (&local_60);
    std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Depth: ",7);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," in ",4);
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," milliseconds\n",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Move: ",6);
    poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
    local_61 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_61,1);
    local_60.super_IBot<uttt::IBoard>._vptr_IBot = (_func_int **)&PTR__IBot_00161830;
    if (local_60.super_IBot<uttt::IBoard>.game != (IBoard *)0x0) {
      operator_delete(local_60.super_IBot<uttt::IBoard>.game);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0xd);
  return;
}

Assistant:

void
BotTest()
{
    IGame game;
    for (int i = 1; i < 13; ++i)
    {
        IBot bot(&game, i);
        auto t1 = std::chrono::high_resolution_clock::now();
        auto m = bot.MakeMove();
        auto t2 = std::chrono::high_resolution_clock::now();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        std::cout << "Depth: " << i << " in " << millis << " milliseconds\n";
        std::cout << "Move: " << m << '\n';
    }
}